

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::Contains(S2Polygon *this,S2Point *p)

{
  atomic<int> *paVar1;
  MutableS2ShapeIndex *this_00;
  int iVar2;
  bool bVar3;
  bool bVar4;
  pointer puVar5;
  long lVar6;
  const_iterator cVar7;
  S2ContainsPointQuery<MutableS2ShapeIndex> local_78;
  
  if (((this->index_).index_status_._M_i == FRESH) ||
     (bVar3 = S2LatLngRect::Contains(&this->bound_,p), bVar3)) {
    if (0x20 < this->num_vertices_) {
      if ((this->index_).index_status_._M_i == FRESH) {
LAB_0020c04d:
        this_00 = &this->index_;
        local_78.options_.vertex_model_ = SEMI_OPEN;
        local_78.it_.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
        local_78.it_.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
        local_78.it_.super_IteratorBase._vptr_IteratorBase =
             (_func_int **)&PTR__IteratorBase_002c10d0;
        local_78.it_.iter_.node =
             (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)0x0;
        local_78.it_.iter_.position = -1;
        local_78.it_.end_.node =
             (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)0x0;
        local_78.it_.end_.position = -1;
        local_78.index_ = this_00;
        if ((this->index_).index_status_._M_i != FRESH) {
          MutableS2ShapeIndex::ApplyUpdatesThreadSafe(this_00);
        }
        local_78.it_.index_ = this_00;
        cVar7 = gtl::internal_btree::
                btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                       *)&(this->index_).cell_map_);
        local_78.it_.iter_.node = cVar7.node;
        local_78.it_.iter_.position = cVar7.position;
        local_78.it_.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
        local_78.it_.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
        local_78.it_.end_.node = local_78.it_.iter_.node;
        local_78.it_.end_.position = local_78.it_.iter_.position;
        bVar3 = S2ContainsPointQuery<MutableS2ShapeIndex>::Contains(&local_78,p);
        return bVar3;
      }
      LOCK();
      paVar1 = &this->unindexed_contains_calls_;
      iVar2 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      if (iVar2 == 0x13) goto LAB_0020c04d;
    }
    puVar5 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3)) {
      lVar6 = 0;
      bVar3 = false;
      do {
        bVar4 = S2Loop::BruteForceContains
                          ((S2Loop *)
                           puVar5[lVar6]._M_t.
                           super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,p);
        bVar3 = (bool)(bVar3 ^ bVar4);
        lVar6 = lVar6 + 1;
        puVar5 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar6 < (int)((ulong)((long)(this->loops_).
                                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5
                                    ) >> 3));
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool S2Polygon::Contains(const S2Point& p) const {
  // NOTE(ericv): A bounds check slows down this function by about 50%.  It is
  // worthwhile only when it might allow us to delay building the index.
  if (!index_.is_fresh() && !bound_.Contains(p)) return false;

  // For small polygons it is faster to just check all the crossings.
  // Otherwise we keep track of the number of calls to Contains() and only
  // build the index once enough calls have been made so that we think it is
  // worth the effort.  See S2Loop::Contains(S2Point) for detailed comments.
  static const int kMaxBruteForceVertices = 32;
  static const int kMaxUnindexedContainsCalls = 20;
  if (num_vertices() <= kMaxBruteForceVertices ||
      (!index_.is_fresh() &&
       ++unindexed_contains_calls_ != kMaxUnindexedContainsCalls)) {
    bool inside = false;
    for (int i = 0; i < num_loops(); ++i) {
      // Use brute force to avoid building the loop's S2ShapeIndex.
      inside ^= loop(i)->BruteForceContains(p);
    }
    return inside;
  }
  // Otherwise we look up the S2ShapeIndex cell containing this point.
  return MakeS2ContainsPointQuery(&index_).Contains(p);
}